

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O1

void Node_Release(thisnode p)

{
  long *plVar1;
  undefined8 *puVar2;
  nodecontext *p_00;
  bool_t bVar3;
  nodeclass *Class;
  
  if (p == (thisnode)0x0) {
    __assert_fail("p",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                  ,0x58d,"void Node_Release(thisnode)");
  }
  if (*(int *)((long)p + 4) != -0xf21f594) {
    __assert_fail("((node*)Node)->Magic==NODE_MAGIC",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                  ,0x88,"void Node_ValidatePtr(anynode *)");
  }
  puVar2 = *(undefined8 **)((long)p + 8);
  p_00 = (nodecontext *)*puVar2;
  plVar1 = (long *)((long)p + 0x18);
  *plVar1 = *plVar1 + -1;
  if (*plVar1 == 0) {
    Node_Notify((node *)p,0xb);
    if (*(long *)((long)p + 0x18) != 0) {
      __assert_fail("((node*)p)->RefCount == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                    ,0x596,"void Node_Release(thisnode)");
    }
    Class = (nodeclass *)(puVar2 + -9);
    bVar3 = CallDelete(p_00,(node *)p,Class);
    if (bVar3 != 0) {
      EraseNode(p_00,(node *)p,Class);
      return;
    }
  }
  return;
}

Assistant:

void Node_Release(thisnode p)
{
    nodecontext* Context;
    assert(p); // we may switch to virtual reference functions later
    Node_ValidatePtr(p);

    Context = Node_Context(p);
    if (--((node*)p)->RefCount == 0)
    {
        const nodeclass* Class = NodeGetClass(p);
        Node_Notify((node*)p,NODE_DELETING);

        assert(((node*)p)->RefCount == 0); // the RefCount may increase during Node_Notify but it shouldn't
        if (CallDelete(Context,p,Class))
            EraseNode(Context,p,Class);
    }
}